

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynNumber * ParseNumber(ParseContext *ctx)

{
  Lexeme *begin;
  bool bVar1;
  Lexeme *end;
  InplaceStr IVar2;
  char *local_50;
  char *local_48;
  undefined1 local_40 [8];
  InplaceStr suffix;
  InplaceStr value;
  Lexeme *start;
  ParseContext *ctx_local;
  
  begin = ctx->currentLexeme;
  bVar1 = ParseContext::At(ctx,lex_number);
  if (bVar1) {
    join_0x00000010_0x00000000_ = ParseContext::Consume(ctx);
    InplaceStr::InplaceStr((InplaceStr *)local_40);
    bVar1 = ParseContext::At(ctx,lex_string);
    if (bVar1) {
      IVar2 = ParseContext::Consume(ctx);
      local_50 = IVar2.begin;
      local_40 = (undefined1  [8])local_50;
      local_48 = IVar2.end;
      suffix.begin = local_48;
    }
    ctx_local = (ParseContext *)ParseContext::get<SynNumber>(ctx);
    end = ParseContext::Previous(ctx);
    IVar2.end = suffix.begin;
    IVar2.begin = (char *)local_40;
    SynNumber::SynNumber((SynNumber *)ctx_local,begin,end,stack0xffffffffffffffd0,IVar2);
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynNumber *)ctx_local;
}

Assistant:

SynNumber* ParseNumber(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.At(lex_number))
	{
		InplaceStr value = ctx.Consume();

		InplaceStr suffix;

		if(ctx.At(lex_string))
			suffix = ctx.Consume();

		return new (ctx.get<SynNumber>()) SynNumber(start, ctx.Previous(), value, suffix);
	}

	return NULL;
}